

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_render_pass2
          (Impl *this,VkRenderPassCreateInfo2 *create_info,ScratchAllocator *alloc,
          VkRenderPassCreateInfo2 **out_create_info)

{
  VkAttachmentDescription2 *__src;
  VkSubpassDescription2 *__src_00;
  VkSubpassDependency2 *__src_01;
  VkAttachmentReference2 *pVVar1;
  void *pvVar2;
  VkImageLayout VVar3;
  VkImageAspectFlags VVar4;
  undefined4 uVar5;
  VkStructureType VVar6;
  undefined4 uVar7;
  bool bVar8;
  VkRenderPassCreateInfo2 *__dest;
  VkAttachmentDescription2 *pVVar9;
  VkSubpassDescription2 *pVVar10;
  VkSubpassDependency2 *pVVar11;
  uint32_t *puVar12;
  VkAttachmentReference2 *pVVar13;
  uint32_t *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  void **ppvVar18;
  bool bVar19;
  size_t sVar20;
  ulong uVar21;
  
  __dest = (VkRenderPassCreateInfo2 *)ScratchAllocator::allocate_raw(alloc,0x50,0x10);
  if (__dest != (VkRenderPassCreateInfo2 *)0x0) {
    memmove(__dest,create_info,0x50);
  }
  if ((ulong)__dest->attachmentCount == 0) {
    pVVar9 = (VkAttachmentDescription2 *)0x0;
  }
  else {
    __src = __dest->pAttachments;
    sVar20 = (ulong)__dest->attachmentCount * 0x38;
    pVVar9 = (VkAttachmentDescription2 *)ScratchAllocator::allocate_raw(alloc,sVar20,0x10);
    if (pVVar9 == (VkAttachmentDescription2 *)0x0) {
      pVVar9 = (VkAttachmentDescription2 *)0x0;
    }
    else {
      memmove(pVVar9,__src,sVar20);
    }
  }
  __dest->pAttachments = pVVar9;
  if ((ulong)__dest->subpassCount == 0) {
    pVVar10 = (VkSubpassDescription2 *)0x0;
  }
  else {
    __src_00 = __dest->pSubpasses;
    sVar20 = (ulong)__dest->subpassCount * 0x58;
    pVVar10 = (VkSubpassDescription2 *)ScratchAllocator::allocate_raw(alloc,sVar20,0x10);
    if (pVVar10 == (VkSubpassDescription2 *)0x0) {
      pVVar10 = (VkSubpassDescription2 *)0x0;
    }
    else {
      memmove(pVVar10,__src_00,sVar20);
    }
  }
  __dest->pSubpasses = pVVar10;
  if ((ulong)__dest->dependencyCount == 0) {
    pVVar11 = (VkSubpassDependency2 *)0x0;
  }
  else {
    __src_01 = __dest->pDependencies;
    sVar20 = (ulong)__dest->dependencyCount * 0x30;
    pVVar11 = (VkSubpassDependency2 *)ScratchAllocator::allocate_raw(alloc,sVar20,0x10);
    if (pVVar11 == (VkSubpassDependency2 *)0x0) {
      pVVar11 = (VkSubpassDependency2 *)0x0;
    }
    else {
      memmove(pVVar11,__src_01,sVar20);
    }
  }
  __dest->pDependencies = pVVar11;
  if ((ulong)__dest->correlatedViewMaskCount == 0) {
    puVar12 = (uint32_t *)0x0;
  }
  else {
    puVar14 = __dest->pCorrelatedViewMasks;
    sVar20 = (ulong)__dest->correlatedViewMaskCount << 2;
    puVar12 = (uint32_t *)ScratchAllocator::allocate_raw(alloc,sVar20,0x10);
    if (puVar12 == (uint32_t *)0x0) {
      puVar12 = (uint32_t *)0x0;
    }
    else {
      memmove(puVar12,puVar14,sVar20);
    }
  }
  __dest->pCorrelatedViewMasks = puVar12;
  pVVar9 = __dest->pAttachments;
  if ((pVVar9 == (VkAttachmentDescription2 *)0x0) ||
     (uVar17 = (ulong)__dest->attachmentCount, uVar17 == 0)) {
LAB_0012bf4d:
    pVVar10 = __dest->pSubpasses;
    if ((pVVar10 != (VkSubpassDescription2 *)0x0) &&
       (uVar17 = (ulong)__dest->subpassCount, uVar17 != 0)) {
      bVar8 = copy_pnext_chain(this,pVVar10->pNext,alloc,&pVVar10->pNext,(DynamicStateInfo *)0x0,0);
      if (!bVar8) {
        return false;
      }
      ppvVar18 = &pVVar10[1].pNext;
      uVar21 = 1;
      do {
        uVar15 = uVar21;
        if (uVar17 == uVar15) break;
        bVar8 = copy_pnext_chain(this,*ppvVar18,alloc,ppvVar18,(DynamicStateInfo *)0x0,0);
        ppvVar18 = ppvVar18 + 0xb;
        uVar21 = uVar15 + 1;
      } while (bVar8);
      if (uVar15 < uVar17) goto LAB_0012c033;
    }
    pVVar11 = __dest->pDependencies;
    if ((pVVar11 != (VkSubpassDependency2 *)0x0) &&
       (uVar17 = (ulong)__dest->dependencyCount, uVar17 != 0)) {
      bVar8 = copy_pnext_chain(this,pVVar11->pNext,alloc,&pVVar11->pNext,(DynamicStateInfo *)0x0,0);
      if (!bVar8) {
        return false;
      }
      ppvVar18 = &pVVar11[1].pNext;
      uVar21 = 1;
      do {
        uVar15 = uVar21;
        if (uVar17 == uVar15) break;
        bVar8 = copy_pnext_chain(this,*ppvVar18,alloc,ppvVar18,(DynamicStateInfo *)0x0,0);
        ppvVar18 = ppvVar18 + 6;
        uVar21 = uVar15 + 1;
      } while (bVar8);
      if (uVar15 < uVar17) goto LAB_0012c033;
    }
    if (__dest->subpassCount != 0) {
      uVar17 = 0;
      do {
        pVVar10 = __dest->pSubpasses;
        pVVar1 = pVVar10[uVar17].pDepthStencilAttachment;
        if (pVVar1 != (VkAttachmentReference2 *)0x0) {
          pVVar13 = (VkAttachmentReference2 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
          if (pVVar13 != (VkAttachmentReference2 *)0x0) {
            VVar6 = pVVar1->sType;
            uVar7 = *(undefined4 *)&pVVar1->field_0x4;
            pvVar2 = pVVar1->pNext;
            VVar3 = pVVar1->layout;
            VVar4 = pVVar1->aspectMask;
            uVar5 = *(undefined4 *)&pVVar1->field_0x1c;
            pVVar13->attachment = pVVar1->attachment;
            pVVar13->layout = VVar3;
            pVVar13->aspectMask = VVar4;
            *(undefined4 *)&pVVar13->field_0x1c = uVar5;
            pVVar13->sType = VVar6;
            *(undefined4 *)&pVVar13->field_0x4 = uVar7;
            pVVar13->pNext = pvVar2;
          }
          pVVar10[uVar17].pDepthStencilAttachment = pVVar13;
        }
        pVVar1 = pVVar10[uVar17].pColorAttachments;
        if (pVVar1 != (VkAttachmentReference2 *)0x0) {
          if ((ulong)pVVar10[uVar17].colorAttachmentCount == 0) {
LAB_0012c0c9:
            pVVar13 = (VkAttachmentReference2 *)0x0;
          }
          else {
            sVar20 = (ulong)pVVar10[uVar17].colorAttachmentCount << 5;
            pVVar13 = (VkAttachmentReference2 *)ScratchAllocator::allocate_raw(alloc,sVar20,0x10);
            if (pVVar13 == (VkAttachmentReference2 *)0x0) goto LAB_0012c0c9;
            memmove(pVVar13,pVVar1,sVar20);
          }
          pVVar10[uVar17].pColorAttachments = pVVar13;
        }
        pVVar1 = pVVar10[uVar17].pResolveAttachments;
        if (pVVar1 != (VkAttachmentReference2 *)0x0) {
          if ((ulong)pVVar10[uVar17].colorAttachmentCount == 0) {
LAB_0012c10e:
            pVVar13 = (VkAttachmentReference2 *)0x0;
          }
          else {
            sVar20 = (ulong)pVVar10[uVar17].colorAttachmentCount << 5;
            pVVar13 = (VkAttachmentReference2 *)ScratchAllocator::allocate_raw(alloc,sVar20,0x10);
            if (pVVar13 == (VkAttachmentReference2 *)0x0) goto LAB_0012c10e;
            memmove(pVVar13,pVVar1,sVar20);
          }
          pVVar10[uVar17].pResolveAttachments = pVVar13;
        }
        pVVar1 = pVVar10[uVar17].pInputAttachments;
        if (pVVar1 != (VkAttachmentReference2 *)0x0) {
          if ((ulong)pVVar10[uVar17].inputAttachmentCount == 0) {
LAB_0012c153:
            pVVar13 = (VkAttachmentReference2 *)0x0;
          }
          else {
            sVar20 = (ulong)pVVar10[uVar17].inputAttachmentCount << 5;
            pVVar13 = (VkAttachmentReference2 *)ScratchAllocator::allocate_raw(alloc,sVar20,0x10);
            if (pVVar13 == (VkAttachmentReference2 *)0x0) goto LAB_0012c153;
            memmove(pVVar13,pVVar1,sVar20);
          }
          pVVar10[uVar17].pInputAttachments = pVVar13;
        }
        puVar12 = pVVar10[uVar17].pPreserveAttachments;
        if (puVar12 != (uint32_t *)0x0) {
          if ((ulong)pVVar10[uVar17].preserveAttachmentCount == 0) {
LAB_0012c198:
            puVar14 = (uint32_t *)0x0;
          }
          else {
            sVar20 = (ulong)pVVar10[uVar17].preserveAttachmentCount << 2;
            puVar14 = (uint32_t *)ScratchAllocator::allocate_raw(alloc,sVar20,0x10);
            if (puVar14 == (uint32_t *)0x0) goto LAB_0012c198;
            memmove(puVar14,puVar12,sVar20);
          }
          pVVar10[uVar17].pPreserveAttachments = puVar14;
        }
        pVVar1 = pVVar10[uVar17].pColorAttachments;
        if ((pVVar1 != (VkAttachmentReference2 *)0x0) &&
           (uVar21 = (ulong)pVVar10[uVar17].colorAttachmentCount, uVar21 != 0)) {
          bVar8 = copy_pnext_chain(this,pVVar1->pNext,alloc,&pVVar1->pNext,(DynamicStateInfo *)0x0,0
                                  );
          if (!bVar8) {
            return false;
          }
          ppvVar18 = &pVVar1[1].pNext;
          uVar15 = 1;
          do {
            uVar16 = uVar15;
            if (uVar21 == uVar16) break;
            bVar8 = copy_pnext_chain(this,*ppvVar18,alloc,ppvVar18,(DynamicStateInfo *)0x0,0);
            ppvVar18 = ppvVar18 + 4;
            uVar15 = uVar16 + 1;
          } while (bVar8);
          if (uVar16 < uVar21) goto LAB_0012c033;
        }
        pVVar1 = pVVar10[uVar17].pInputAttachments;
        if ((pVVar1 != (VkAttachmentReference2 *)0x0) &&
           (uVar21 = (ulong)pVVar10[uVar17].inputAttachmentCount, uVar21 != 0)) {
          bVar8 = copy_pnext_chain(this,pVVar1->pNext,alloc,&pVVar1->pNext,(DynamicStateInfo *)0x0,0
                                  );
          if (!bVar8) {
            return false;
          }
          ppvVar18 = &pVVar1[1].pNext;
          uVar15 = 1;
          do {
            uVar16 = uVar15;
            if (uVar21 == uVar16) break;
            bVar8 = copy_pnext_chain(this,*ppvVar18,alloc,ppvVar18,(DynamicStateInfo *)0x0,0);
            ppvVar18 = ppvVar18 + 4;
            uVar15 = uVar16 + 1;
          } while (bVar8);
          if (uVar16 < uVar21) goto LAB_0012c033;
        }
        pVVar1 = pVVar10[uVar17].pResolveAttachments;
        if ((pVVar1 != (VkAttachmentReference2 *)0x0) &&
           (uVar21 = (ulong)pVVar10[uVar17].colorAttachmentCount, uVar21 != 0)) {
          bVar8 = copy_pnext_chain(this,pVVar1->pNext,alloc,&pVVar1->pNext,(DynamicStateInfo *)0x0,0
                                  );
          if (!bVar8) {
            return false;
          }
          ppvVar18 = &pVVar1[1].pNext;
          uVar15 = 1;
          do {
            uVar16 = uVar15;
            if (uVar21 == uVar16) break;
            bVar8 = copy_pnext_chain(this,*ppvVar18,alloc,ppvVar18,(DynamicStateInfo *)0x0,0);
            ppvVar18 = ppvVar18 + 4;
            uVar15 = uVar16 + 1;
          } while (bVar8);
          if (uVar16 < uVar21) goto LAB_0012c033;
        }
        pVVar1 = pVVar10[uVar17].pDepthStencilAttachment;
        if ((pVVar1 != (VkAttachmentReference2 *)0x0) &&
           (bVar8 = copy_pnext_chain(this,pVVar1->pNext,alloc,&pVVar1->pNext,(DynamicStateInfo *)0x0
                                     ,0), !bVar8)) {
          return false;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < __dest->subpassCount);
    }
    bVar19 = false;
    bVar8 = copy_pnext_chain(this,create_info->pNext,alloc,&__dest->pNext,(DynamicStateInfo *)0x0,0)
    ;
    if (bVar8) {
      *out_create_info = __dest;
      bVar19 = true;
    }
  }
  else {
    bVar8 = copy_pnext_chain(this,pVVar9->pNext,alloc,&pVVar9->pNext,(DynamicStateInfo *)0x0,0);
    if (!bVar8) {
      return false;
    }
    ppvVar18 = &pVVar9[1].pNext;
    uVar21 = 1;
    do {
      uVar15 = uVar21;
      if (uVar17 == uVar15) break;
      bVar8 = copy_pnext_chain(this,*ppvVar18,alloc,ppvVar18,(DynamicStateInfo *)0x0,0);
      ppvVar18 = ppvVar18 + 7;
      uVar21 = uVar15 + 1;
    } while (bVar8);
    if (uVar17 <= uVar15) goto LAB_0012bf4d;
LAB_0012c033:
    bVar19 = false;
  }
  return bVar19;
}

Assistant:

bool StateRecorder::Impl::copy_render_pass2(const VkRenderPassCreateInfo2 *create_info, ScratchAllocator &alloc,
                                            VkRenderPassCreateInfo2 **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->pAttachments = copy(info->pAttachments, info->attachmentCount, alloc);
	info->pSubpasses = copy(info->pSubpasses, info->subpassCount, alloc);
	info->pDependencies = copy(info->pDependencies, info->dependencyCount, alloc);
	info->pCorrelatedViewMasks = copy(info->pCorrelatedViewMasks, info->correlatedViewMaskCount, alloc);

	if (info->pAttachments && !copy_pnext_chains(info->pAttachments, info->attachmentCount, alloc, nullptr, 0))
		return false;
	if (info->pSubpasses && !copy_pnext_chains(info->pSubpasses, info->subpassCount, alloc, nullptr, 0))
		return false;
	if (info->pDependencies && !copy_pnext_chains(info->pDependencies, info->dependencyCount, alloc, nullptr, 0))
		return false;

	for (uint32_t i = 0; i < info->subpassCount; i++)
	{
		auto &sub = const_cast<VkSubpassDescription2 &>(info->pSubpasses[i]);
		if (sub.pDepthStencilAttachment)
			sub.pDepthStencilAttachment = copy(sub.pDepthStencilAttachment, 1, alloc);
		if (sub.pColorAttachments)
			sub.pColorAttachments = copy(sub.pColorAttachments, sub.colorAttachmentCount, alloc);
		if (sub.pResolveAttachments)
			sub.pResolveAttachments = copy(sub.pResolveAttachments, sub.colorAttachmentCount, alloc);
		if (sub.pInputAttachments)
			sub.pInputAttachments = copy(sub.pInputAttachments, sub.inputAttachmentCount, alloc);
		if (sub.pPreserveAttachments)
			sub.pPreserveAttachments = copy(sub.pPreserveAttachments, sub.preserveAttachmentCount, alloc);

		if (sub.pColorAttachments && !copy_pnext_chains(sub.pColorAttachments, sub.colorAttachmentCount, alloc, nullptr, 0))
			return false;
		if (sub.pInputAttachments && !copy_pnext_chains(sub.pInputAttachments, sub.inputAttachmentCount, alloc, nullptr, 0))
			return false;
		if (sub.pResolveAttachments && !copy_pnext_chains(sub.pResolveAttachments, sub.colorAttachmentCount, alloc, nullptr, 0))
			return false;
		if (sub.pDepthStencilAttachment && !copy_pnext_chains(sub.pDepthStencilAttachment, 1, alloc, nullptr, 0))
			return false;
	}

	if (!copy_pnext_chain(create_info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}